

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBiDirectionalLSTMLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  int iVar1;
  Rep *pRVar2;
  string *psVar3;
  NeuralNetworkLayer *this_00;
  bool bVar4;
  BiDirectionalLSTMLayerParams *pBVar5;
  UniDirectionalLSTMLayerParams *pUVar6;
  uint64_t expectedUnits;
  void **ppvVar7;
  uint64_t expectedUnits_00;
  LSTMParams *pLVar8;
  WeightParams *pWVar9;
  long lVar10;
  LSTMWeightParams *lstmWeightParams;
  allocator local_1ea;
  allocator local_1e9;
  string local_1e8;
  uint64_t local_1c8;
  Result *local_1c0;
  NeuralNetworkLayer *local_1b8;
  string local_1b0;
  undefined1 local_190 [40];
  Type *local_168;
  Type *local_160;
  Result r;
  BiDirectionalLSTMLayerParams recurrent;
  string err;
  LSTMParams lstmParams;
  LSTMParams local_70;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)&recurrent,layer,1,5);
  Result::operator=(&r,(Result *)&recurrent);
  std::__cxx11::string::~string((string *)&recurrent._internal_metadata_);
  bVar4 = Result::good(&r);
  if (bVar4) {
    validateOutputCount((Result *)&recurrent,layer,5,5);
    Result::operator=(&r,(Result *)&recurrent);
    std::__cxx11::string::~string((string *)&recurrent._internal_metadata_);
  }
  bVar4 = Result::good(&r);
  if ((bVar4) && (bVar4 = Result::good(&r), bVar4)) {
    if (this->ndArrayInterpretation == true) {
      std::__cxx11::string::string((string *)&local_50,"BiDirectionalLSTM",(allocator *)local_190);
      validateInputOutputRankEquality((Result *)&recurrent,layer,&local_50,&this->blobNameToRank);
      Result::operator=(&r,(Result *)&recurrent);
      std::__cxx11::string::~string((string *)&recurrent._internal_metadata_);
      std::__cxx11::string::~string((string *)&local_50);
      bVar4 = Result::good(&r);
      if (bVar4) {
        std::__cxx11::string::string
                  ((string *)local_190,"BiDirectionalLSTM",(allocator *)&lstmParams);
        validateRankCount((Result *)&recurrent,layer,(string *)local_190,5,5,&this->blobNameToRank);
        Result::operator=(&r,(Result *)&recurrent);
        std::__cxx11::string::~string((string *)&recurrent._internal_metadata_);
        std::__cxx11::string::~string((string *)local_190);
        bVar4 = Result::good(&r);
        if (bVar4) goto LAB_00595bb1;
      }
    }
    else {
LAB_00595bb1:
      local_1c0 = __return_storage_ptr__;
      local_1b8 = layer;
      pBVar5 = Specification::NeuralNetworkLayer::bidirectionallstm(layer);
      pRVar2 = (pBVar5->activationsforwardlstm_).super_RepeatedPtrFieldBase.rep_;
      ppvVar7 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar7 = (void **)0x0;
      }
      iVar1 = (pBVar5->activationsforwardlstm_).super_RepeatedPtrFieldBase.current_size_;
      lVar10 = 0;
      do {
        if ((long)iVar1 * 8 == lVar10) break;
        validateRecurrentActivationParams
                  ((Result *)&recurrent,*(ActivationParams **)((long)ppvVar7 + lVar10));
        Result::operator=(&r,(Result *)&recurrent);
        std::__cxx11::string::~string((string *)&recurrent._internal_metadata_);
        bVar4 = Result::good(&r);
        lVar10 = lVar10 + 8;
      } while (bVar4);
      pBVar5 = Specification::NeuralNetworkLayer::bidirectionallstm(local_1b8);
      pRVar2 = (pBVar5->activationsbackwardlstm_).super_RepeatedPtrFieldBase.rep_;
      ppvVar7 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar7 = (void **)0x0;
      }
      iVar1 = (pBVar5->activationsbackwardlstm_).super_RepeatedPtrFieldBase.current_size_;
      lVar10 = 0;
      do {
        if ((long)iVar1 * 8 == lVar10) break;
        validateRecurrentActivationParams
                  ((Result *)&recurrent,*(ActivationParams **)((long)ppvVar7 + lVar10));
        Result::operator=(&r,(Result *)&recurrent);
        std::__cxx11::string::~string((string *)&recurrent._internal_metadata_);
        bVar4 = Result::good(&r);
        lVar10 = lVar10 + 8;
      } while (bVar4);
      this_00 = local_1b8;
      pUVar6 = Specification::NeuralNetworkLayer::unidirectionallstm(local_1b8);
      __return_storage_ptr__ = local_1c0;
      lstmWeightParams = pUVar6->weightparams_;
      if (lstmWeightParams == (LSTMWeightParams *)0x0) {
        lstmWeightParams = (LSTMWeightParams *)&Specification::_LSTMWeightParams_default_instance_;
      }
      pUVar6 = Specification::NeuralNetworkLayer::unidirectionallstm(this_00);
      pLVar8 = pUVar6->params_;
      if (pLVar8 == (LSTMParams *)0x0) {
        pLVar8 = (LSTMParams *)&Specification::_LSTMParams_default_instance_;
      }
      Specification::LSTMParams::LSTMParams(&local_70,pLVar8);
      validateLSTMWeightParams((Result *)&recurrent,lstmWeightParams,&local_70);
      Result::operator=(&r,(Result *)&recurrent);
      std::__cxx11::string::~string((string *)&recurrent._internal_metadata_);
      Specification::LSTMParams::~LSTMParams(&local_70);
      bVar4 = Result::good(&r);
      if (bVar4) {
        pBVar5 = Specification::NeuralNetworkLayer::bidirectionallstm(this_00);
        Specification::BiDirectionalLSTMLayerParams::BiDirectionalLSTMLayerParams(&recurrent,pBVar5)
        ;
        pLVar8 = recurrent.params_;
        if (recurrent.params_ == (LSTMParams *)0x0) {
          pLVar8 = (LSTMParams *)&Specification::_LSTMParams_default_instance_;
        }
        Specification::LSTMParams::LSTMParams(&lstmParams,pLVar8);
        err._M_dataplus._M_p = (pointer)&err.field_2;
        err._M_string_length = 0;
        err.field_2._M_local_buf[0] = '\0';
        if (recurrent.activationsforwardlstm_.super_RepeatedPtrFieldBase.current_size_ == 3) {
          if (recurrent.activationsbackwardlstm_.super_RepeatedPtrFieldBase.current_size_ != 3) {
            std::operator+(&local_1e8,"Bidirectional LSTM layer:",(this_00->name_).ptr_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_190,&local_1e8," backward lstm must provide 3 activations");
            goto LAB_00597453;
          }
          local_1c8 = recurrent.outputvectorsize_;
          local_160 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                                (&recurrent.weightparams_.super_RepeatedPtrFieldBase,0);
          local_168 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                                (&recurrent.weightparams_.super_RepeatedPtrFieldBase,1);
          pWVar9 = local_160->inputgateweightmatrix_;
          if (pWVar9 == (WeightParams *)0x0) {
            pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          std::__cxx11::string::string((string *)&local_1e8,"Bidirectional LSTM",&local_1e9);
          psVar3 = (this_00->name_).ptr_;
          std::__cxx11::string::string
                    ((string *)&local_1b0,"forward input gate weight matrix",&local_1ea);
          expectedUnits_00 = recurrent.inputvectorsize_ * local_1c8;
          validateGeneralWeightParams
                    ((Result *)local_190,pWVar9,expectedUnits_00,local_1c8,&local_1e8,psVar3,
                     &local_1b0);
          Result::operator=(&r,(Result *)local_190);
          std::__cxx11::string::~string((string *)(local_190 + 8));
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_1e8);
          bVar4 = Result::good(&r);
          if (bVar4) {
            pWVar9 = local_160->forgetgateweightmatrix_;
            if (pWVar9 == (WeightParams *)0x0) {
              pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            std::__cxx11::string::string((string *)&local_1e8,"Bidirectional LSTM",&local_1e9);
            psVar3 = (this_00->name_).ptr_;
            std::__cxx11::string::string
                      ((string *)&local_1b0,"forward forget gate weight matrix",&local_1ea);
            validateGeneralWeightParams
                      ((Result *)local_190,pWVar9,expectedUnits_00,local_1c8,&local_1e8,psVar3,
                       &local_1b0);
            Result::operator=(&r,(Result *)local_190);
            std::__cxx11::string::~string((string *)(local_190 + 8));
            std::__cxx11::string::~string((string *)&local_1b0);
            std::__cxx11::string::~string((string *)&local_1e8);
            bVar4 = Result::good(&r);
            if (bVar4) {
              pWVar9 = local_160->blockinputweightmatrix_;
              if (pWVar9 == (WeightParams *)0x0) {
                pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              std::__cxx11::string::string((string *)&local_1e8,"Bidirectional LSTM",&local_1e9);
              psVar3 = (this_00->name_).ptr_;
              std::__cxx11::string::string
                        ((string *)&local_1b0,"forward block input gate weight matrix",&local_1ea);
              validateGeneralWeightParams
                        ((Result *)local_190,pWVar9,expectedUnits_00,local_1c8,&local_1e8,psVar3,
                         &local_1b0);
              Result::operator=(&r,(Result *)local_190);
              std::__cxx11::string::~string((string *)(local_190 + 8));
              std::__cxx11::string::~string((string *)&local_1b0);
              std::__cxx11::string::~string((string *)&local_1e8);
              bVar4 = Result::good(&r);
              if (bVar4) {
                pWVar9 = local_160->outputgateweightmatrix_;
                if (pWVar9 == (WeightParams *)0x0) {
                  pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                std::__cxx11::string::string((string *)&local_1e8,"Bidirectional LSTM",&local_1e9);
                psVar3 = (this_00->name_).ptr_;
                std::__cxx11::string::string
                          ((string *)&local_1b0,"forward output gate weight matrix",&local_1ea);
                validateGeneralWeightParams
                          ((Result *)local_190,pWVar9,expectedUnits_00,local_1c8,&local_1e8,psVar3,
                           &local_1b0);
                Result::operator=(&r,(Result *)local_190);
                std::__cxx11::string::~string((string *)(local_190 + 8));
                std::__cxx11::string::~string((string *)&local_1b0);
                std::__cxx11::string::~string((string *)&local_1e8);
                bVar4 = Result::good(&r);
                if (bVar4) {
                  pWVar9 = local_160->inputgaterecursionmatrix_;
                  if (pWVar9 == (WeightParams *)0x0) {
                    pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                  }
                  std::__cxx11::string::string((string *)&local_1e8,"Bidirectional LSTM",&local_1e9)
                  ;
                  psVar3 = (this_00->name_).ptr_;
                  std::__cxx11::string::string
                            ((string *)&local_1b0,"forward input gate recursion matrix",&local_1ea);
                  expectedUnits = local_1c8 * local_1c8;
                  validateGeneralWeightParams
                            ((Result *)local_190,pWVar9,expectedUnits,local_1c8,&local_1e8,psVar3,
                             &local_1b0);
                  Result::operator=(&r,(Result *)local_190);
                  std::__cxx11::string::~string((string *)(local_190 + 8));
                  std::__cxx11::string::~string((string *)&local_1b0);
                  std::__cxx11::string::~string((string *)&local_1e8);
                  bVar4 = Result::good(&r);
                  if (bVar4) {
                    pWVar9 = local_160->forgetgaterecursionmatrix_;
                    if (pWVar9 == (WeightParams *)0x0) {
                      pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                    }
                    std::__cxx11::string::string
                              ((string *)&local_1e8,"Bidirectional LSTM",&local_1e9);
                    psVar3 = (this_00->name_).ptr_;
                    std::__cxx11::string::string
                              ((string *)&local_1b0,"forward forget gate recursion matrix",
                               &local_1ea);
                    validateGeneralWeightParams
                              ((Result *)local_190,pWVar9,expectedUnits,local_1c8,&local_1e8,psVar3,
                               &local_1b0);
                    Result::operator=(&r,(Result *)local_190);
                    std::__cxx11::string::~string((string *)(local_190 + 8));
                    std::__cxx11::string::~string((string *)&local_1b0);
                    std::__cxx11::string::~string((string *)&local_1e8);
                    bVar4 = Result::good(&r);
                    if (bVar4) {
                      pWVar9 = local_160->blockinputrecursionmatrix_;
                      if (pWVar9 == (WeightParams *)0x0) {
                        pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                      }
                      std::__cxx11::string::string
                                ((string *)&local_1e8,"Bidirectional LSTM",&local_1e9);
                      psVar3 = (this_00->name_).ptr_;
                      std::__cxx11::string::string
                                ((string *)&local_1b0,"forward block input gate recursion matrix",
                                 &local_1ea);
                      validateGeneralWeightParams
                                ((Result *)local_190,pWVar9,expectedUnits,local_1c8,&local_1e8,
                                 psVar3,&local_1b0);
                      Result::operator=(&r,(Result *)local_190);
                      std::__cxx11::string::~string((string *)(local_190 + 8));
                      std::__cxx11::string::~string((string *)&local_1b0);
                      std::__cxx11::string::~string((string *)&local_1e8);
                      bVar4 = Result::good(&r);
                      if (bVar4) {
                        pWVar9 = local_160->outputgaterecursionmatrix_;
                        if (pWVar9 == (WeightParams *)0x0) {
                          pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                        }
                        std::__cxx11::string::string
                                  ((string *)&local_1e8,"Bidirectional LSTM",&local_1e9);
                        psVar3 = (this_00->name_).ptr_;
                        std::__cxx11::string::string
                                  ((string *)&local_1b0,"forward output gate recursion matrix",
                                   &local_1ea);
                        validateGeneralWeightParams
                                  ((Result *)local_190,pWVar9,expectedUnits,local_1c8,&local_1e8,
                                   psVar3,&local_1b0);
                        Result::operator=(&r,(Result *)local_190);
                        std::__cxx11::string::~string((string *)(local_190 + 8));
                        std::__cxx11::string::~string((string *)&local_1b0);
                        std::__cxx11::string::~string((string *)&local_1e8);
                        bVar4 = Result::good(&r);
                        if (bVar4) {
                          pWVar9 = local_168->inputgateweightmatrix_;
                          if (pWVar9 == (WeightParams *)0x0) {
                            pWVar9 = (WeightParams *)&Specification::_WeightParams_default_instance_
                            ;
                          }
                          std::__cxx11::string::string
                                    ((string *)&local_1e8,"Bidirectional LSTM",&local_1e9);
                          psVar3 = (local_1b8->name_).ptr_;
                          std::__cxx11::string::string
                                    ((string *)&local_1b0,"backward input gate weight matrix",
                                     &local_1ea);
                          validateGeneralWeightParams
                                    ((Result *)local_190,pWVar9,expectedUnits_00,local_1c8,
                                     &local_1e8,psVar3,&local_1b0);
                          Result::operator=(&r,(Result *)local_190);
                          std::__cxx11::string::~string((string *)(local_190 + 8));
                          std::__cxx11::string::~string((string *)&local_1b0);
                          std::__cxx11::string::~string((string *)&local_1e8);
                          bVar4 = Result::good(&r);
                          __return_storage_ptr__ = local_1c0;
                          if (bVar4) {
                            pWVar9 = local_168->forgetgateweightmatrix_;
                            if (pWVar9 == (WeightParams *)0x0) {
                              pWVar9 = (WeightParams *)
                                       &Specification::_WeightParams_default_instance_;
                            }
                            std::__cxx11::string::string
                                      ((string *)&local_1e8,"Bidirectional LSTM",&local_1e9);
                            psVar3 = (local_1b8->name_).ptr_;
                            std::__cxx11::string::string
                                      ((string *)&local_1b0,"backward forget gate weight matrix",
                                       &local_1ea);
                            validateGeneralWeightParams
                                      ((Result *)local_190,pWVar9,expectedUnits_00,local_1c8,
                                       &local_1e8,psVar3,&local_1b0);
                            Result::operator=(&r,(Result *)local_190);
                            std::__cxx11::string::~string((string *)(local_190 + 8));
                            std::__cxx11::string::~string((string *)&local_1b0);
                            std::__cxx11::string::~string((string *)&local_1e8);
                            bVar4 = Result::good(&r);
                            __return_storage_ptr__ = local_1c0;
                            if (bVar4) {
                              pWVar9 = local_168->blockinputweightmatrix_;
                              if (pWVar9 == (WeightParams *)0x0) {
                                pWVar9 = (WeightParams *)
                                         &Specification::_WeightParams_default_instance_;
                              }
                              std::__cxx11::string::string
                                        ((string *)&local_1e8,"Bidirectional LSTM",&local_1e9);
                              psVar3 = (local_1b8->name_).ptr_;
                              std::__cxx11::string::string
                                        ((string *)&local_1b0,
                                         "backward block input gate weight matrix",&local_1ea);
                              validateGeneralWeightParams
                                        ((Result *)local_190,pWVar9,expectedUnits_00,local_1c8,
                                         &local_1e8,psVar3,&local_1b0);
                              Result::operator=(&r,(Result *)local_190);
                              std::__cxx11::string::~string((string *)(local_190 + 8));
                              std::__cxx11::string::~string((string *)&local_1b0);
                              std::__cxx11::string::~string((string *)&local_1e8);
                              bVar4 = Result::good(&r);
                              __return_storage_ptr__ = local_1c0;
                              if (bVar4) {
                                pWVar9 = local_168->outputgateweightmatrix_;
                                if (pWVar9 == (WeightParams *)0x0) {
                                  pWVar9 = (WeightParams *)
                                           &Specification::_WeightParams_default_instance_;
                                }
                                std::__cxx11::string::string
                                          ((string *)&local_1e8,"Bidirectional LSTM",&local_1e9);
                                psVar3 = (local_1b8->name_).ptr_;
                                std::__cxx11::string::string
                                          ((string *)&local_1b0,"backward output gate weight matrix"
                                           ,&local_1ea);
                                validateGeneralWeightParams
                                          ((Result *)local_190,pWVar9,expectedUnits_00,local_1c8,
                                           &local_1e8,psVar3,&local_1b0);
                                Result::operator=(&r,(Result *)local_190);
                                std::__cxx11::string::~string((string *)(local_190 + 8));
                                std::__cxx11::string::~string((string *)&local_1b0);
                                std::__cxx11::string::~string((string *)&local_1e8);
                                bVar4 = Result::good(&r);
                                __return_storage_ptr__ = local_1c0;
                                if (bVar4) {
                                  pWVar9 = local_168->inputgaterecursionmatrix_;
                                  if (pWVar9 == (WeightParams *)0x0) {
                                    pWVar9 = (WeightParams *)
                                             &Specification::_WeightParams_default_instance_;
                                  }
                                  std::__cxx11::string::string
                                            ((string *)&local_1e8,"Bidirectional LSTM",&local_1e9);
                                  psVar3 = (local_1b8->name_).ptr_;
                                  std::__cxx11::string::string
                                            ((string *)&local_1b0,
                                             "backward input gate recursion matrix",&local_1ea);
                                  validateGeneralWeightParams
                                            ((Result *)local_190,pWVar9,expectedUnits,local_1c8,
                                             &local_1e8,psVar3,&local_1b0);
                                  Result::operator=(&r,(Result *)local_190);
                                  std::__cxx11::string::~string((string *)(local_190 + 8));
                                  std::__cxx11::string::~string((string *)&local_1b0);
                                  std::__cxx11::string::~string((string *)&local_1e8);
                                  bVar4 = Result::good(&r);
                                  __return_storage_ptr__ = local_1c0;
                                  if (bVar4) {
                                    pWVar9 = local_168->forgetgaterecursionmatrix_;
                                    if (pWVar9 == (WeightParams *)0x0) {
                                      pWVar9 = (WeightParams *)
                                               &Specification::_WeightParams_default_instance_;
                                    }
                                    std::__cxx11::string::string
                                              ((string *)&local_1e8,"Bidirectional LSTM",&local_1e9)
                                    ;
                                    psVar3 = (local_1b8->name_).ptr_;
                                    std::__cxx11::string::string
                                              ((string *)&local_1b0,
                                               "backward forget gate recursion matrix",&local_1ea);
                                    validateGeneralWeightParams
                                              ((Result *)local_190,pWVar9,expectedUnits,local_1c8,
                                               &local_1e8,psVar3,&local_1b0);
                                    Result::operator=(&r,(Result *)local_190);
                                    std::__cxx11::string::~string((string *)(local_190 + 8));
                                    std::__cxx11::string::~string((string *)&local_1b0);
                                    std::__cxx11::string::~string((string *)&local_1e8);
                                    bVar4 = Result::good(&r);
                                    __return_storage_ptr__ = local_1c0;
                                    if (bVar4) {
                                      pWVar9 = local_168->blockinputrecursionmatrix_;
                                      if (pWVar9 == (WeightParams *)0x0) {
                                        pWVar9 = (WeightParams *)
                                                 &Specification::_WeightParams_default_instance_;
                                      }
                                      std::__cxx11::string::string
                                                ((string *)&local_1e8,"Bidirectional LSTM",
                                                 &local_1e9);
                                      psVar3 = (local_1b8->name_).ptr_;
                                      std::__cxx11::string::string
                                                ((string *)&local_1b0,
                                                 "backward block input gate recursion matrix",
                                                 &local_1ea);
                                      validateGeneralWeightParams
                                                ((Result *)local_190,pWVar9,expectedUnits,local_1c8,
                                                 &local_1e8,psVar3,&local_1b0);
                                      Result::operator=(&r,(Result *)local_190);
                                      std::__cxx11::string::~string((string *)(local_190 + 8));
                                      std::__cxx11::string::~string((string *)&local_1b0);
                                      std::__cxx11::string::~string((string *)&local_1e8);
                                      bVar4 = Result::good(&r);
                                      __return_storage_ptr__ = local_1c0;
                                      if (bVar4) {
                                        pWVar9 = local_168->outputgaterecursionmatrix_;
                                        if (pWVar9 == (WeightParams *)0x0) {
                                          pWVar9 = (WeightParams *)
                                                   &Specification::_WeightParams_default_instance_;
                                        }
                                        std::__cxx11::string::string
                                                  ((string *)&local_1e8,"Bidirectional LSTM",
                                                   &local_1e9);
                                        psVar3 = (local_1b8->name_).ptr_;
                                        std::__cxx11::string::string
                                                  ((string *)&local_1b0,
                                                   "backward output gate recursion matrix",
                                                   &local_1ea);
                                        validateGeneralWeightParams
                                                  ((Result *)local_190,pWVar9,expectedUnits,
                                                   local_1c8,&local_1e8,psVar3,&local_1b0);
                                        Result::operator=(&r,(Result *)local_190);
                                        std::__cxx11::string::~string((string *)(local_190 + 8));
                                        std::__cxx11::string::~string((string *)&local_1b0);
                                        std::__cxx11::string::~string((string *)&local_1e8);
                                        bVar4 = Result::good(&r);
                                        __return_storage_ptr__ = local_1c0;
                                        if (bVar4) {
                                          pLVar8 = recurrent.params_;
                                          if (recurrent.params_ == (LSTMParams *)0x0) {
                                            pLVar8 = (LSTMParams *)
                                                     &Specification::_LSTMParams_default_instance_;
                                          }
                                          if (pLVar8->hasbiasvectors_ == true) {
                                            pWVar9 = local_160->inputgatebiasvector_;
                                            if (pWVar9 == (WeightParams *)0x0) {
                                              pWVar9 = (WeightParams *)
                                                       &Specification::
                                                        _WeightParams_default_instance_;
                                            }
                                            std::__cxx11::string::string
                                                      ((string *)&local_1e8,"Bidirectional LSTM",
                                                       &local_1e9);
                                            psVar3 = (local_1b8->name_).ptr_;
                                            std::__cxx11::string::string
                                                      ((string *)&local_1b0,
                                                       "forward input gate bias vector",&local_1ea);
                                            validateGeneralWeightParams
                                                      ((Result *)local_190,pWVar9,local_1c8,1,
                                                       &local_1e8,psVar3,&local_1b0);
                                            Result::operator=(&r,(Result *)local_190);
                                            std::__cxx11::string::~string((string *)(local_190 + 8))
                                            ;
                                            std::__cxx11::string::~string((string *)&local_1b0);
                                            std::__cxx11::string::~string((string *)&local_1e8);
                                            bVar4 = Result::good(&r);
                                            __return_storage_ptr__ = local_1c0;
                                            if (bVar4) {
                                              pWVar9 = local_160->forgetgatebiasvector_;
                                              if (pWVar9 == (WeightParams *)0x0) {
                                                pWVar9 = (WeightParams *)
                                                         &Specification::
                                                          _WeightParams_default_instance_;
                                              }
                                              std::__cxx11::string::string
                                                        ((string *)&local_1e8,"Bidirectional LSTM",
                                                         &local_1e9);
                                              psVar3 = (local_1b8->name_).ptr_;
                                              std::__cxx11::string::string
                                                        ((string *)&local_1b0,
                                                         "forward forget gate bias vector",
                                                         &local_1ea);
                                              validateGeneralWeightParams
                                                        ((Result *)local_190,pWVar9,local_1c8,1,
                                                         &local_1e8,psVar3,&local_1b0);
                                              Result::operator=(&r,(Result *)local_190);
                                              std::__cxx11::string::~string
                                                        ((string *)(local_190 + 8));
                                              std::__cxx11::string::~string((string *)&local_1b0);
                                              std::__cxx11::string::~string((string *)&local_1e8);
                                              bVar4 = Result::good(&r);
                                              __return_storage_ptr__ = local_1c0;
                                              if (bVar4) {
                                                pWVar9 = local_160->blockinputbiasvector_;
                                                if (pWVar9 == (WeightParams *)0x0) {
                                                  pWVar9 = (WeightParams *)
                                                           &Specification::
                                                            _WeightParams_default_instance_;
                                                }
                                                std::__cxx11::string::string
                                                          ((string *)&local_1e8,"Bidirectional LSTM"
                                                           ,&local_1e9);
                                                psVar3 = (local_1b8->name_).ptr_;
                                                std::__cxx11::string::string
                                                          ((string *)&local_1b0,
                                                           "forward block input bias vector",
                                                           &local_1ea);
                                                validateGeneralWeightParams
                                                          ((Result *)local_190,pWVar9,local_1c8,1,
                                                           &local_1e8,psVar3,&local_1b0);
                                                Result::operator=(&r,(Result *)local_190);
                                                std::__cxx11::string::~string
                                                          ((string *)(local_190 + 8));
                                                std::__cxx11::string::~string((string *)&local_1b0);
                                                std::__cxx11::string::~string((string *)&local_1e8);
                                                bVar4 = Result::good(&r);
                                                __return_storage_ptr__ = local_1c0;
                                                if (bVar4) {
                                                  pWVar9 = local_160->outputgatebiasvector_;
                                                  if (pWVar9 == (WeightParams *)0x0) {
                                                    pWVar9 = (WeightParams *)
                                                             &Specification::
                                                              _WeightParams_default_instance_;
                                                  }
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1e8,
                                                             "Bidirectional LSTM",&local_1e9);
                                                  psVar3 = (local_1b8->name_).ptr_;
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1b0,
                                                             "forward output gate bias vector",
                                                             &local_1ea);
                                                  validateGeneralWeightParams
                                                            ((Result *)local_190,pWVar9,local_1c8,1,
                                                             &local_1e8,psVar3,&local_1b0);
                                                  Result::operator=(&r,(Result *)local_190);
                                                  std::__cxx11::string::~string
                                                            ((string *)(local_190 + 8));
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1b0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1e8);
                                                  bVar4 = Result::good(&r);
                                                  __return_storage_ptr__ = local_1c0;
                                                  if (bVar4) {
                                                    pWVar9 = local_168->inputgatebiasvector_;
                                                    if (pWVar9 == (WeightParams *)0x0) {
                                                      pWVar9 = (WeightParams *)
                                                               &Specification::
                                                                _WeightParams_default_instance_;
                                                    }
                                                    std::__cxx11::string::string
                                                              ((string *)&local_1e8,
                                                               "Bidirectional LSTM",&local_1e9);
                                                    psVar3 = (local_1b8->name_).ptr_;
                                                    std::__cxx11::string::string
                                                              ((string *)&local_1b0,
                                                               "backward input gate bias vector",
                                                               &local_1ea);
                                                    validateGeneralWeightParams
                                                              ((Result *)local_190,pWVar9,local_1c8,
                                                               1,&local_1e8,psVar3,&local_1b0);
                                                    Result::operator=(&r,(Result *)local_190);
                                                    std::__cxx11::string::~string
                                                              ((string *)(local_190 + 8));
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1b0);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1e8);
                                                    bVar4 = Result::good(&r);
                                                    __return_storage_ptr__ = local_1c0;
                                                    if (bVar4) {
                                                      pWVar9 = local_168->forgetgatebiasvector_;
                                                      if (pWVar9 == (WeightParams *)0x0) {
                                                        pWVar9 = (WeightParams *)
                                                                 &Specification::
                                                                  _WeightParams_default_instance_;
                                                      }
                                                      std::__cxx11::string::string
                                                                ((string *)&local_1e8,
                                                                 "Bidirectional LSTM",&local_1e9);
                                                      psVar3 = (local_1b8->name_).ptr_;
                                                      std::__cxx11::string::string
                                                                ((string *)&local_1b0,
                                                                 "backward forget gate bias vector",
                                                                 &local_1ea);
                                                      validateGeneralWeightParams
                                                                ((Result *)local_190,pWVar9,
                                                                 local_1c8,1,&local_1e8,psVar3,
                                                                 &local_1b0);
                                                      Result::operator=(&r,(Result *)local_190);
                                                      std::__cxx11::string::~string
                                                                ((string *)(local_190 + 8));
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_1b0);
                                                      std::__cxx11::string::~string
                                                                ((string *)&local_1e8);
                                                      bVar4 = Result::good(&r);
                                                      __return_storage_ptr__ = local_1c0;
                                                      if (bVar4) {
                                                        pWVar9 = local_168->blockinputbiasvector_;
                                                        if (pWVar9 == (WeightParams *)0x0) {
                                                          pWVar9 = (WeightParams *)
                                                                   &Specification::
                                                                    _WeightParams_default_instance_;
                                                        }
                                                        std::__cxx11::string::string
                                                                  ((string *)&local_1e8,
                                                                   "Bidirectional LSTM",&local_1e9);
                                                        psVar3 = (local_1b8->name_).ptr_;
                                                        std::__cxx11::string::string
                                                                  ((string *)&local_1b0,
                                                                                                                                      
                                                  "backward block input bias vector",&local_1ea);
                                                  validateGeneralWeightParams
                                                            ((Result *)local_190,pWVar9,local_1c8,1,
                                                             &local_1e8,psVar3,&local_1b0);
                                                  Result::operator=(&r,(Result *)local_190);
                                                  std::__cxx11::string::~string
                                                            ((string *)(local_190 + 8));
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1b0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1e8);
                                                  bVar4 = Result::good(&r);
                                                  __return_storage_ptr__ = local_1c0;
                                                  if (bVar4) {
                                                    pWVar9 = local_168->outputgatebiasvector_;
                                                    if (pWVar9 == (WeightParams *)0x0) {
                                                      pWVar9 = (WeightParams *)
                                                               &Specification::
                                                                _WeightParams_default_instance_;
                                                    }
                                                    std::__cxx11::string::string
                                                              ((string *)&local_1e8,
                                                               "Bidirectional LSTM",&local_1e9);
                                                    psVar3 = (local_1b8->name_).ptr_;
                                                    std::__cxx11::string::string
                                                              ((string *)&local_1b0,
                                                               "backward output gate bias vector",
                                                               &local_1ea);
                                                    validateGeneralWeightParams
                                                              ((Result *)local_190,pWVar9,local_1c8,
                                                               1,&local_1e8,psVar3,&local_1b0);
                                                    Result::operator=(&r,(Result *)local_190);
                                                    std::__cxx11::string::~string
                                                              ((string *)(local_190 + 8));
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1b0);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1e8);
                                                    bVar4 = Result::good(&r);
                                                    __return_storage_ptr__ = local_1c0;
                                                    if (bVar4) goto LAB_00596f45;
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                          else {
LAB_00596f45:
                                            if (recurrent.params_ == (LSTMParams *)0x0) {
                                              recurrent.params_ =
                                                   (LSTMParams *)
                                                   &Specification::_LSTMParams_default_instance_;
                                            }
                                            __return_storage_ptr__ = local_1c0;
                                            if ((recurrent.params_)->haspeepholevectors_ == true) {
                                              pWVar9 = local_160->inputgatepeepholevector_;
                                              if (pWVar9 == (WeightParams *)0x0) {
                                                pWVar9 = (WeightParams *)
                                                         &Specification::
                                                          _WeightParams_default_instance_;
                                              }
                                              std::__cxx11::string::string
                                                        ((string *)&local_1e8,"Bidirectional LSTM",
                                                         &local_1e9);
                                              psVar3 = (local_1b8->name_).ptr_;
                                              std::__cxx11::string::string
                                                        ((string *)&local_1b0,
                                                         "forward input gate peephole vector",
                                                         &local_1ea);
                                              validateGeneralWeightParams
                                                        ((Result *)local_190,pWVar9,local_1c8,1,
                                                         &local_1e8,psVar3,&local_1b0);
                                              Result::operator=(&r,(Result *)local_190);
                                              std::__cxx11::string::~string
                                                        ((string *)(local_190 + 8));
                                              std::__cxx11::string::~string((string *)&local_1b0);
                                              std::__cxx11::string::~string((string *)&local_1e8);
                                              bVar4 = Result::good(&r);
                                              __return_storage_ptr__ = local_1c0;
                                              if (bVar4) {
                                                pWVar9 = local_160->forgetgatepeepholevector_;
                                                if (pWVar9 == (WeightParams *)0x0) {
                                                  pWVar9 = (WeightParams *)
                                                           &Specification::
                                                            _WeightParams_default_instance_;
                                                }
                                                std::__cxx11::string::string
                                                          ((string *)&local_1e8,"Bidirectional LSTM"
                                                           ,&local_1e9);
                                                psVar3 = (local_1b8->name_).ptr_;
                                                std::__cxx11::string::string
                                                          ((string *)&local_1b0,
                                                           "forward forget gate peephole vector",
                                                           &local_1ea);
                                                validateGeneralWeightParams
                                                          ((Result *)local_190,pWVar9,local_1c8,1,
                                                           &local_1e8,psVar3,&local_1b0);
                                                Result::operator=(&r,(Result *)local_190);
                                                std::__cxx11::string::~string
                                                          ((string *)(local_190 + 8));
                                                std::__cxx11::string::~string((string *)&local_1b0);
                                                std::__cxx11::string::~string((string *)&local_1e8);
                                                bVar4 = Result::good(&r);
                                                __return_storage_ptr__ = local_1c0;
                                                if (bVar4) {
                                                  pWVar9 = local_160->outputgatepeepholevector_;
                                                  if (pWVar9 == (WeightParams *)0x0) {
                                                    pWVar9 = (WeightParams *)
                                                             &Specification::
                                                              _WeightParams_default_instance_;
                                                  }
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1e8,
                                                             "Bidirectional LSTM",&local_1e9);
                                                  psVar3 = (local_1b8->name_).ptr_;
                                                  std::__cxx11::string::string
                                                            ((string *)&local_1b0,
                                                             "forward output gate peephole vector",
                                                             &local_1ea);
                                                  validateGeneralWeightParams
                                                            ((Result *)local_190,pWVar9,local_1c8,1,
                                                             &local_1e8,psVar3,&local_1b0);
                                                  Result::operator=(&r,(Result *)local_190);
                                                  std::__cxx11::string::~string
                                                            ((string *)(local_190 + 8));
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1b0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1e8);
                                                  bVar4 = Result::good(&r);
                                                  __return_storage_ptr__ = local_1c0;
                                                  if (bVar4) {
                                                    pWVar9 = local_168->inputgatepeepholevector_;
                                                    if (pWVar9 == (WeightParams *)0x0) {
                                                      pWVar9 = (WeightParams *)
                                                               &Specification::
                                                                _WeightParams_default_instance_;
                                                    }
                                                    std::__cxx11::string::string
                                                              ((string *)&local_1e8,
                                                               "Bidirectional LSTM",&local_1e9);
                                                    psVar3 = (local_1b8->name_).ptr_;
                                                    std::__cxx11::string::string
                                                              ((string *)&local_1b0,
                                                               "backward input gate peephole vector"
                                                               ,&local_1ea);
                                                    validateGeneralWeightParams
                                                              ((Result *)local_190,pWVar9,local_1c8,
                                                               1,&local_1e8,psVar3,&local_1b0);
                                                    Result::operator=(&r,(Result *)local_190);
                                                    std::__cxx11::string::~string
                                                              ((string *)(local_190 + 8));
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1b0);
                                                    std::__cxx11::string::~string
                                                              ((string *)&local_1e8);
                                                    bVar4 = Result::good(&r);
                                                    __return_storage_ptr__ = local_1c0;
                                                    if (bVar4) {
                                                      pWVar9 = local_168->forgetgatepeepholevector_;
                                                      if (pWVar9 == (WeightParams *)0x0) {
                                                        pWVar9 = (WeightParams *)
                                                                 &Specification::
                                                                  _WeightParams_default_instance_;
                                                      }
                                                      std::__cxx11::string::string
                                                                ((string *)&local_1e8,
                                                                 "Bidirectional LSTM",&local_1e9);
                                                      psVar3 = (local_1b8->name_).ptr_;
                                                      std::__cxx11::string::string
                                                                ((string *)&local_1b0,
                                                                                                                                  
                                                  "backward forget gate peephole vector",&local_1ea)
                                                  ;
                                                  validateGeneralWeightParams
                                                            ((Result *)local_190,pWVar9,local_1c8,1,
                                                             &local_1e8,psVar3,&local_1b0);
                                                  Result::operator=(&r,(Result *)local_190);
                                                  std::__cxx11::string::~string
                                                            ((string *)(local_190 + 8));
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1b0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1e8);
                                                  bVar4 = Result::good(&r);
                                                  __return_storage_ptr__ = local_1c0;
                                                  if (bVar4) {
                                                    pWVar9 = local_168->outputgatepeepholevector_;
                                                    if (pWVar9 == (WeightParams *)0x0) {
                                                      pWVar9 = (WeightParams *)
                                                               &Specification::
                                                                _WeightParams_default_instance_;
                                                    }
                                                    std::__cxx11::string::string
                                                              ((string *)&local_1e8,
                                                               "Bidirectional LSTM",&local_1e9);
                                                    psVar3 = (local_1b8->name_).ptr_;
                                                    std::__cxx11::string::string
                                                              ((string *)&local_1b0,
                                                                                                                              
                                                  "backward output gate peephole vector",&local_1ea)
                                                  ;
                                                  validateGeneralWeightParams
                                                            ((Result *)local_190,pWVar9,local_1c8,1,
                                                             &local_1e8,psVar3,&local_1b0);
                                                  Result::operator=(&r,(Result *)local_190);
                                                  std::__cxx11::string::~string
                                                            ((string *)(local_190 + 8));
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1b0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1e8);
                                                  Result::good(&r);
                                                  __return_storage_ptr__ = local_1c0;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          Result::Result(__return_storage_ptr__,&r);
        }
        else {
          std::operator+(&local_1e8,"Bidirectional LSTM layer:",(this_00->name_).ptr_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_190,&local_1e8," forward lstm must provide 3 activations");
LAB_00597453:
          std::__cxx11::string::operator=((string *)&err,(string *)local_190);
          std::__cxx11::string::~string((string *)local_190);
          std::__cxx11::string::~string((string *)&local_1e8);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
        }
        std::__cxx11::string::~string((string *)&err);
        Specification::LSTMParams::~LSTMParams(&lstmParams);
        Specification::BiDirectionalLSTMLayerParams::~BiDirectionalLSTMLayerParams(&recurrent);
        goto LAB_005973d9;
      }
    }
  }
  Result::Result(__return_storage_ptr__,&r);
LAB_005973d9:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBiDirectionalLSTMLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    // Must specify hidden states
    r = validateInputCount(layer, 1, 5);
    if (r.good()) {
        r = validateOutputCount(layer, 5, 5);
    }
    if (!r.good()) {
        return r;
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "BiDirectionalLSTM", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "BiDirectionalLSTM", 5, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    for (const auto& activation : layer.bidirectionallstm().activationsforwardlstm()) {
        r = validateRecurrentActivationParams(activation);
        if (!r.good()) {
            break;
        }
    }
    for (const auto& activation : layer.bidirectionallstm().activationsbackwardlstm()) {
        r = validateRecurrentActivationParams(activation);
        if (!r.good()) {
            break;
        }
    }

    // Validate common LSTM params and ensure that all weight field types are consistent
    r = validateLSTMWeightParams(layer.unidirectionallstm().weightparams(), layer.unidirectionallstm().params());
    if (!r.good()) {
        return r;
    }

    Specification::BiDirectionalLSTMLayerParams recurrent = layer.bidirectionallstm();
    Specification::LSTMParams lstmParams = recurrent.params();
    std::string err;

    if (recurrent.activationsforwardlstm_size() != 3) {
        err = std::string("Bidirectional LSTM layer:" + layer.name() + " forward lstm must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (recurrent.activationsbackwardlstm_size() != 3){
        err = std::string("Bidirectional LSTM layer:" + layer.name() + " backward lstm must provide 3 activations");
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Verify weights and biases sizes
    uint64_t h = recurrent.outputvectorsize();
    uint64_t x = recurrent.inputvectorsize();
    const Specification::LSTMWeightParams& weightParamsF = recurrent.weightparams(0);
    const Specification::LSTMWeightParams& weightParamsB = recurrent.weightparams(1);

    // Check forward weight matrices' sizes
    r = validateGeneralWeightParams(weightParamsF.inputgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "forward input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.forgetgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "forward forget gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.blockinputweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "forward block input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.outputgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "forward output gate weight matrix");
    if(!r.good()) return r;
    // Check forward recursion matrices' sizes
    r = validateGeneralWeightParams(weightParamsF.inputgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "forward input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.forgetgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "forward forget gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.blockinputrecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "forward block input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsF.outputgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "forward output gate recursion matrix");
    if(!r.good()) return r;
    // Check backward weight matrices' sizes
    r = validateGeneralWeightParams(weightParamsB.inputgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "backward input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.forgetgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "backward forget gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.blockinputweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "backward block input gate weight matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.outputgateweightmatrix(), h*x, h,
                                    "Bidirectional LSTM", layer.name(), "backward output gate weight matrix");
    if(!r.good()) return r;
    // Check backward recursion matrices' sizes
    r = validateGeneralWeightParams(weightParamsB.inputgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "backward input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.forgetgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "backward forget gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.blockinputrecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "backward block input gate recursion matrix");
    if(!r.good()) return r;
    r = validateGeneralWeightParams(weightParamsB.outputgaterecursionmatrix(), h*h, h,
                                    "Bidirectional LSTM", layer.name(), "backward output gate recursion matrix");
    if(!r.good()) return r;

    // Check bias vectors
    if (recurrent.params().hasbiasvectors()) {
        r = validateGeneralWeightParams(weightParamsF.inputgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward input gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsF.forgetgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward forget gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsF.blockinputbiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward block input bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsF.outputgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward output gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.inputgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward input gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.forgetgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward forget gate bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.blockinputbiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward block input bias vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.outputgatebiasvector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward output gate bias vector");
        if(!r.good()) return r;
    }
    // Check peephole vectors
    if (recurrent.params().haspeepholevectors()){
        r = validateGeneralWeightParams(weightParamsF.inputgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward input gate peephole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsF.forgetgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward forget gate peephole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsF.outputgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "forward output gate peephole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.inputgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward input gate peephole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.forgetgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward forget gate peephole vector");
        if(!r.good()) return r;
        r = validateGeneralWeightParams(weightParamsB.outputgatepeepholevector(), h, 1,
                                        "Bidirectional LSTM", layer.name(), "backward output gate peephole vector");
        if(!r.good()) return r;
    }
    return r;
}